

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O3

void arm_debug_excp_handler_aarch64(CPUState *cs)

{
  anon_union_16_2_aaf24f3d_for_entry *paVar1;
  CPUARMState_conflict *env;
  CPUWatchpoint *pCVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  TranslationBlock *pTVar7;
  CPUBreakpoint *bp;
  TranslationBlock *pTVar8;
  CPUBreakpoint *pCVar9;
  uint uVar10;
  uint32_t syndrome;
  uint32_t excp;
  uint uVar11;
  CPUBreakpoint *pCVar12;
  bool bVar13;
  
  env = (CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b);
  pCVar2 = cs->watchpoint_hit;
  if (pCVar2 != (CPUWatchpoint *)0x0) {
    uVar10 = pCVar2->flags;
    if ((uVar10 & 0x20) == 0) {
      return;
    }
    iVar4 = arm_debug_target_el(env);
    iVar5 = arm_current_el(env);
    cs->watchpoint_hit = (CPUWatchpoint *)0x0;
    uVar6 = arm_debug_exception_fsr(env);
    *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2c2c) = uVar6;
    cs[1].tb_jmp_cache[0x586] = (TranslationBlock *)pCVar2->hitaddr;
    syndrome = (uVar10 >> 1 & 0x40) + (uint)(iVar4 == iVar5) * 0x4000000 + 0xd2000022;
    uVar6 = arm_debug_target_el(env);
    excp = 4;
LAB_0060b923:
    raise_exception_aarch64(env,excp,syndrome,uVar6);
  }
  iVar4 = *(int *)((long)cs[1].tb_jmp_cache + 0x21a4);
  if (iVar4 == 0) {
    pTVar7 = (TranslationBlock *)(ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2094);
    pTVar8 = cs[1].tb_jmp_cache[0xa11];
    if (((ulong)pTVar8 & 0x200000000) == 0) goto LAB_0060b97a;
    bVar13 = true;
    if ((*(uint *)((long)cs[1].tb_jmp_cache + 0x21ac) & 0x1f) != 0x16) goto LAB_0060b994;
LAB_0060b9c1:
    uVar10 = (uint)(byte)(((uint)pTVar8 >> 0x1c & 1) == 0 & bVar13) * 2 + 1;
    bVar3 = false;
  }
  else {
    pTVar7 = cs[1].tb_jmp_cache[0x433];
    pTVar8 = cs[1].tb_jmp_cache[0xa11];
    if (((ulong)pTVar8 & 0x200000000) == 0) {
LAB_0060b97a:
      bVar3 = true;
      bVar13 = false;
    }
    else {
      bVar13 = true;
      if ((~*(uint *)(cs[1].tb_jmp_cache + 0x434) & 0xc) == 0) goto LAB_0060b9c1;
LAB_0060b994:
      bVar13 = ((ulong)cs[1].tb_jmp_cache[0x483] & 1) == 0;
      bVar3 = false;
    }
    if ((((ulong)pTVar8 >> 0x20 & 1) == 0 || bVar13 != false) ||
       ((uVar10 = 2, (*(byte *)((long)cs[1].tb_jmp_cache + 0x2413) & 8) == 0 &&
        ((*(byte *)((long)cs[1].tb_jmp_cache + 0x2851) & 1) == 0)))) {
      if (!bVar3) goto LAB_0060b9c1;
      uVar10 = 1;
      bVar3 = true;
    }
  }
  if (((uint)pTVar8 >> 9 & 1) != 0) {
    uVar11 = 1;
    if (*(int *)(cs[1].tb_jmp_cache + 0x579) == 0) {
      uVar11 = ~*(uint *)((long)cs[1].tb_jmp_cache +
                         (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b8c) & 1;
    }
    goto LAB_0060ba8f;
  }
  if (iVar4 != 0) {
    uVar11 = *(uint *)(cs[1].tb_jmp_cache + 0x434) >> 2 & 3;
    goto LAB_0060ba8f;
  }
  uVar11 = *(uint *)((long)cs[1].tb_jmp_cache + 0x21ac) & 0x1f;
  if (uVar11 == 0x10) {
    uVar11 = 0;
    goto LAB_0060ba8f;
  }
  if (uVar11 == 0x16) {
LAB_0060ba8a:
    uVar11 = 3;
  }
  else {
    if (uVar11 == 0x1a) {
      uVar11 = 2;
      goto LAB_0060ba8f;
    }
    if (!bVar3) {
      if (uVar11 == 0x16) {
        uVar11 = 3;
        if (((uint)pTVar8 >> 0x1c & 1) == 0) goto LAB_0060ba8f;
      }
      else if (((ulong)pTVar8 & 0x10000000) == 0 && ((ulong)cs[1].tb_jmp_cache[0x483] & 1) == 0)
      goto LAB_0060ba8a;
    }
    uVar11 = 1;
  }
LAB_0060ba8f:
  pCVar9 = (cs->breakpoints).tqh_first;
  pCVar12 = pCVar9;
  if (pCVar9 != (CPUBreakpoint *)0x0) {
    do {
      if (((TranslationBlock *)pCVar12->pc == pTVar7) && ((pCVar12->flags & 0x10) != 0)) {
        return;
      }
      paVar1 = &pCVar12->entry;
      pCVar12 = paVar1->tqe_next;
    } while (paVar1->tqe_next != (CPUBreakpoint *)0x0);
    do {
      if (((TranslationBlock *)pCVar9->pc == pTVar7) && ((pCVar9->flags & 0x20) != 0)) {
        uVar6 = arm_debug_exception_fsr(env);
        *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2c2c) = uVar6;
        cs[1].tb_jmp_cache[0x586] = (TranslationBlock *)0x0;
        syndrome = (uint)(uVar10 == uVar11) << 0x1a | 0xc2000022;
        uVar6 = arm_debug_target_el(env);
        excp = 3;
        goto LAB_0060b923;
      }
      pCVar9 = (pCVar9->entry).tqe_next;
    } while (pCVar9 != (CPUBreakpoint *)0x0);
  }
  return;
}

Assistant:

void arm_debug_excp_handler(CPUState *cs)
{
    /*
     * Called by core code when a watchpoint or breakpoint fires;
     * need to check which one and raise the appropriate exception.
     */
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    CPUWatchpoint *wp_hit = cs->watchpoint_hit;

    if (wp_hit) {
        if (wp_hit->flags & BP_CPU) {
            bool wnr = (wp_hit->flags & BP_WATCHPOINT_HIT_WRITE) != 0;
            bool same_el = arm_debug_target_el(env) == arm_current_el(env);

            cs->watchpoint_hit = NULL;

            env->exception.fsr = arm_debug_exception_fsr(env);
            env->exception.vaddress = wp_hit->hitaddr;
            raise_exception(env, EXCP_DATA_ABORT,
                    syn_watchpoint(same_el, 0, wnr),
                    arm_debug_target_el(env));
        }
    } else {
        uint64_t pc = is_a64(env) ? env->pc : env->regs[15];
        bool same_el = (arm_debug_target_el(env) == arm_current_el(env));

        /*
         * (1) GDB breakpoints should be handled first.
         * (2) Do not raise a CPU exception if no CPU breakpoint has fired,
         * since singlestep is also done by generating a debug internal
         * exception.
         */
        if (cpu_breakpoint_test(cs, pc, BP_GDB)
            || !cpu_breakpoint_test(cs, pc, BP_CPU)) {
            return;
        }

        env->exception.fsr = arm_debug_exception_fsr(env);
        /*
         * FAR is UNKNOWN: clear vaddress to avoid potentially exposing
         * values to the guest that it shouldn't be able to see at its
         * exception/security level.
         */
        env->exception.vaddress = 0;
        raise_exception(env, EXCP_PREFETCH_ABORT,
                        syn_breakpoint(same_el),
                        arm_debug_target_el(env));
    }
}